

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  int32_t iVar2;
  byte bVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  Descriptor *expected;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  CppStringType CVar11;
  LongSooRep *pLVar12;
  MapFieldBase *this_01;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  RepeatedPtrFieldBase *pRVar13;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *paVar14;
  undefined8 *puVar15;
  EnumValueDescriptor *pEVar16;
  int *piVar17;
  int32_t *piVar18;
  undefined1 *puVar19;
  Cord *pCVar20;
  ArenaStringPtr *this_03;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar21;
  Metadata MVar22;
  string_view src;
  
  MVar22 = Message::GetMetadata(message);
  if (MVar22.reflection != this) goto LAB_00f5b973;
  if (field->containing_type_ != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  bVar3 = field->field_0x1;
  if ((bVar3 & 8) != 0) {
    uVar9 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    protobuf::internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),field->number_
              );
    return;
  }
  if (0xbf < bVar3 != (bool)((bVar3 & 0x20) >> 5)) {
    ClearField();
LAB_00f5b95f:
    ClearField();
LAB_00f5b969:
    ClearField();
LAB_00f5b973:
    expected = this->descriptor_;
    MVar22 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar22.descriptor,field,"ClearField")
    ;
  }
  if ((bVar3 & 0x20) != 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
    case 8:
      VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 2:
      VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<long>::set_size((RepeatedField<long> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 3:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<unsigned_int>::set_size
                ((RepeatedField<unsigned_int> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 4:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 5:
      VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<double>::set_size((RepeatedField<double> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 6:
      VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<float>::set_size((RepeatedField<float> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 7:
      VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
      pLVar12 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar12->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      bVar7 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      iVar8 = protobuf::internal::SooRep::size((SooRep *)pLVar12,bVar7);
      if ((iVar8 != 0) && ((pLVar12->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar12);
      }
      RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar12,(uVar4 & 4) == 0,0);
      return;
    case 9:
      goto switchD_00f5b1d8_caseD_9;
    case 10:
      if ((field->type_ == 0xb) && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)) {
        VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
        this_01 = (MapFieldBase *)MutableRawImpl(this,message,field);
        protobuf::internal::MapFieldBase::Clear(this_01);
        return;
      }
      VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
      pRVar13 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
      protobuf::internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar13);
      return;
    default:
      return;
    }
  }
  this_00 = &this->schema_;
  bVar7 = protobuf::internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar7) {
    ClearOneofField(this,message,field);
    return;
  }
  bVar7 = HasFieldSingular(this,message,field);
  if (!bVar7) {
    return;
  }
  if ((field->options_->field_0)._impl_.weak_ == true) goto LAB_00f5b95f;
  uVar9 = protobuf::internal::ReflectionSchema::HasBitIndex(this_00,field);
  if (uVar9 != 0xffffffff) {
    if ((this->schema_).has_bits_offset_ != -1) {
      bVar3 = (byte)uVar9 & 0x1f;
      uVar10 = protobuf::internal::ReflectionSchema::HasBitsOffset(this_00);
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar9 >> 5) * 4 + (ulong)uVar10);
      *puVar1 = *puVar1 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      goto LAB_00f5b315;
    }
    goto LAB_00f5b969;
  }
LAB_00f5b315:
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    iVar8 = (field->field_20).default_value_int32_t_;
    goto LAB_00f5b7b6;
  case 2:
    aVar21 = field->field_20;
    VerifyFieldType<long>(this,field);
    goto LAB_00f5b7e2;
  case 3:
    iVar8 = (field->field_20).default_value_int32_t_;
    VerifyFieldType<unsigned_int>(this,field);
    goto LAB_00f5b7c1;
  case 4:
    aVar21 = field->field_20;
    VerifyFieldType<unsigned_long>(this,field);
LAB_00f5b7e2:
    paVar14 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)MutableRawImpl(this,message,field);
    *paVar14 = aVar21;
    break;
  case 5:
    aVar21 = field->field_20;
    VerifyFieldType<double>(this,field);
    paVar14 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)MutableRawImpl(this,message,field);
    *paVar14 = aVar21;
    break;
  case 6:
    iVar2 = (field->field_20).default_value_int32_t_;
    VerifyFieldType<float>(this,field);
    piVar18 = (int32_t *)MutableRawImpl(this,message,field);
    *piVar18 = iVar2;
    break;
  case 7:
    bVar7 = (field->field_20).default_value_bool_;
    VerifyFieldType<bool>(this,field);
    puVar19 = (undefined1 *)MutableRawImpl(this,message,field);
    *puVar19 = bVar7;
    break;
  case 8:
    pEVar16 = FieldDescriptor::default_value_enum(field);
    iVar8 = pEVar16->number_;
LAB_00f5b7b6:
    VerifyFieldType<int>(this,field);
LAB_00f5b7c1:
    piVar17 = (int *)MutableRawImpl(this,message,field);
    *piVar17 = iVar8;
    break;
  case 9:
    CVar11 = FieldDescriptor::cpp_string_type(field);
    if ((CVar11 == kView) || (CVar11 == kString)) {
      bVar7 = protobuf::internal::ReflectionSchema::IsFieldInlined(this_00,field);
      if (bVar7) {
        VerifyFieldType<google::protobuf::internal::InlinedStringField>(this,field);
        puVar15 = (undefined8 *)MutableRawImpl(this,message,field);
        puVar15[1] = 0;
        *(undefined1 *)*puVar15 = 0;
      }
      else {
        VerifyFieldType<google::protobuf::internal::ArenaStringPtr>(this,field);
        this_03 = (ArenaStringPtr *)MutableRawImpl(this,message,field);
        protobuf::internal::ArenaStringPtr::Destroy(this_03);
        (this_03->tagged_ptr_).ptr_ = &protobuf::internal::fixed_address_empty_string;
      }
    }
    else if (CVar11 == kCord) {
      if ((field->field_0x1 & 1) != 0) {
        pcVar5 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
        sVar6 = ((field->field_20).default_value_string_)->_M_string_length;
        VerifyFieldType<absl::lts_20250127::Cord>(this,field);
        pCVar20 = (Cord *)MutableRawImpl(this,message,field);
        src._M_str = pcVar5;
        src._M_len = sVar6;
        absl::lts_20250127::Cord::operator=(pCVar20,src);
        return;
      }
      VerifyFieldType<absl::lts_20250127::Cord>(this,field);
      pCVar20 = (Cord *)MutableRawImpl(this,message,field);
      absl::lts_20250127::Cord::Clear(pCVar20);
      return;
    }
    break;
  case 10:
    VerifyFieldType<google::protobuf::Message*>(this,field);
    puVar15 = (undefined8 *)MutableRawImpl(this,message,field);
    (**(code **)(*(long *)*puVar15 + 0x10))();
    return;
  }
  return;
switchD_00f5b1d8_caseD_9:
  CVar11 = FieldDescriptor::cpp_string_type(field);
  if ((CVar11 != kView) && (CVar11 != kString)) {
    if (CVar11 != kCord) {
      return;
    }
    VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
    this_02 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
    RepeatedField<absl::lts_20250127::Cord>::Clear(this_02);
    return;
  }
  VerifyFieldType<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
  pRVar13 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar13);
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(ClearField, message);
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (schema_.InRealOneof(field)) {
      ClearOneofField(message, field);
      return;
    }
    if (HasFieldSingular(*message, field)) {
      ClearHasBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32_t);
        CLEAR_TYPE(INT64, int64_t);
        CLEAR_TYPE(UINT32, uint32_t);
        CLEAR_TYPE(UINT64, uint64_t);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (field->has_default_value()) {
                *MutableRaw<absl::Cord>(message, field) =
                    field->default_value_string();
              } else {
                MutableRaw<absl::Cord>(message, field)->Clear();
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                // Currently, string with default value can't be inlined. So we
                // don't have to handle default value here.
                MutableRaw<InlinedStringField>(message, field)->ClearToEmpty();
              } else if (IsMicroString(field)) {
                if (field->has_default_value()) {
                  // TODO: Use an unowned block instead.
                  MutableRaw<MicroString>(message, field)
                      ->Set(field->default_value_string(), message->GetArena());
                } else {
                  MutableRaw<MicroString>(message, field)->Clear();
                }
              } else {
                auto* str = MutableRaw<ArenaStringPtr>(message, field);
                str->Destroy();
                str->InitDefault();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->Clear();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}